

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

String * __thiscall Json::toHex16Bit_abi_cxx11_(String *__return_storage_ptr__,Json *this,uint x)

{
  char cVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x04');
  uVar2 = (ulong)((uint)((ulong)this >> 8) & 0xff);
  cVar1 = hex2[uVar2 * 2 + 1];
  *(__return_storage_ptr__->_M_dataplus)._M_p = hex2[uVar2 * 2];
  (__return_storage_ptr__->_M_dataplus)._M_p[1] = cVar1;
  uVar2 = (ulong)((uint)this & 0xff);
  cVar1 = hex2[uVar2 * 2 + 1];
  (__return_storage_ptr__->_M_dataplus)._M_p[2] = hex2[uVar2 * 2];
  (__return_storage_ptr__->_M_dataplus)._M_p[3] = cVar1;
  return __return_storage_ptr__;
}

Assistant:

static String toHex16Bit(unsigned int x) {
  const unsigned int hi = (x >> 8) & 0xff;
  const unsigned int lo = x & 0xff;
  String result(4, ' ');
  result[0] = hex2[2 * hi];
  result[1] = hex2[2 * hi + 1];
  result[2] = hex2[2 * lo];
  result[3] = hex2[2 * lo + 1];
  return result;
}